

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

void tcu::lookupQuad(ColorQuad *dst,ConstPixelBufferAccess *level,Sampler *sampler,int x0,int x1,
                    int y0,int y1,int z)

{
  undefined8 local_6c;
  undefined8 local_64;
  undefined8 local_5c;
  undefined8 local_54;
  void *local_4c;
  TextureFormat local_44;
  TextureFormat local_3c;
  undefined8 local_34;
  int local_2c;
  int local_28;
  int y0_local;
  int x1_local;
  int x0_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  ColorQuad *dst_local;
  
  local_2c = y0;
  local_28 = x1;
  y0_local = x0;
  _x1_local = sampler;
  sampler_local = (Sampler *)level;
  level_local = (ConstPixelBufferAccess *)dst;
  lookup<float>((tcu *)&local_3c,level,sampler,x0,y0,z);
  level_local->m_format = local_3c;
  *(undefined8 *)(level_local->m_size).m_data = local_34;
  lookup<float>((tcu *)&local_4c,(ConstPixelBufferAccess *)sampler_local,_x1_local,local_28,local_2c
                ,z);
  level_local->m_data = local_4c;
  level_local[1].m_format = local_44;
  lookup<float>((tcu *)&local_5c,(ConstPixelBufferAccess *)sampler_local,_x1_local,y0_local,y1,z);
  *(undefined8 *)((level_local->m_size).m_data + 2) = local_5c;
  *(undefined8 *)((level_local->m_pitch).m_data + 1) = local_54;
  lookup<float>((tcu *)&local_6c,(ConstPixelBufferAccess *)sampler_local,_x1_local,local_28,y1,z);
  *(undefined8 *)level_local[1].m_size.m_data = local_6c;
  *(undefined8 *)(level_local[1].m_size.m_data + 2) = local_64;
  return;
}

Assistant:

static void lookupQuad (ColorQuad& dst, const ConstPixelBufferAccess& level, const Sampler& sampler, int x0, int x1, int y0, int y1, int z)
{
	dst.p00	= lookup<float>(level, sampler, x0, y0, z);
	dst.p10	= lookup<float>(level, sampler, x1, y0, z);
	dst.p01	= lookup<float>(level, sampler, x0, y1, z);
	dst.p11	= lookup<float>(level, sampler, x1, y1, z);
}